

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

bool FBehavior::StaticCheckAllGood(void)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = StaticModules.Count == 0;
  if ((!bVar3) && (bVar1 = IsGood(*StaticModules.Array), bVar1)) {
    uVar2 = 1;
    do {
      bVar3 = StaticModules.Count <= uVar2;
      if (bVar3) {
        return bVar3;
      }
      bVar1 = IsGood(StaticModules.Array[uVar2]);
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  return bVar3;
}

Assistant:

bool FBehavior::StaticCheckAllGood ()
{
	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		if (!StaticModules[i]->IsGood())
		{
			return false;
		}
	}
	return true;
}